

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O3

int f2(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  lVar1 = N_VGetArrayPointer();
  lVar2 = N_VGetArrayPointer(ydot);
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      dVar5 = *(double *)(lVar1 + lVar4 * 8) * -2.0;
      if (lVar4 != 0) {
        dVar5 = dVar5 + *(double *)(lVar1 + -8 + lVar4 * 8);
      }
      if (lVar3 != 0) {
        dVar5 = dVar5 + *(double *)(lVar1 + -0x28 + lVar4 * 8);
      }
      *(double *)(lVar2 + lVar4 * 8) = dVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    lVar3 = lVar3 + 1;
    lVar1 = lVar1 + 0x28;
    lVar2 = lVar2 + 0x28;
  } while (lVar3 != 5);
  return 0;
}

Assistant:

static int f2(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunindextype i, j, k;
  sunrealtype d, *ydata, *dydata;

  ydata  = N_VGetArrayPointer(y);
  dydata = N_VGetArrayPointer(ydot);

  /*
     Excluding boundaries,

     ydot    = f    = -2 y    + alpha1 * y      + alpha2 * y
         i,j    i,j       i,j             i-1,j             i,j-1
  */

  for (j = 0; j < P2_MESHY; j++)
  {
    for (i = 0; i < P2_MESHX; i++)
    {
      k = i + j * P2_MESHX;
      d = -TWO * ydata[k];
      if (i != 0) { d += P2_ALPH1 * ydata[k - 1]; }
      if (j != 0) { d += P2_ALPH2 * ydata[k - P2_MESHX]; }
      dydata[k] = d;
    }
  }

  return (0);
}